

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

int tcmalloc::SymbolizePrinter::pcinfo_success
              (void *data,uintptr_t pc,char *filename,int lineno,char *function)

{
  SymbolizePrinter *printer;
  char *function_local;
  int lineno_local;
  char *filename_local;
  uintptr_t pc_local;
  void *data_local;
  
  if (function != (char *)0x0) {
    DemangleAndPrint((SymbolizePrinter *)data,pc,filename,lineno,function,0);
  }
  else {
    *(undefined1 *)((long)data + 0x20) = 1;
  }
  data_local._4_4_ = (uint)(function == (char *)0x0);
  return data_local._4_4_;
}

Assistant:

static int pcinfo_success(void* data, uintptr_t pc, const char* filename, int lineno, const char* function) {
    auto printer = static_cast<SymbolizePrinter*>(data);
    if (function == nullptr) {
      printer->want_syminfo_ = true;
      return 1;
    }

    printer->DemangleAndPrint(pc, filename, lineno, function, 0);

    return 0;
  }